

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

__pid_t __thiscall acto::core::event::wait(event *this,void *__stat_loc)

{
  __pid_t _Var1;
  cv_status cVar2;
  long lVar3;
  unique_lock<std::mutex> g;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  deadline;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  deadline.__d.__r = (duration)(lVar3 + (long)__stat_loc);
  std::unique_lock<std::mutex>::unique_lock(&g,&this->mutex_);
  do {
    if (this->triggered_ != false) goto LAB_00108674;
    cVar2 = std::condition_variable::
            __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                      (&this->cond_,&g,&deadline);
  } while (cVar2 != timeout);
  if (this->triggered_ == false) {
    _Var1 = 2;
  }
  else {
LAB_00108674:
    this->triggered_ = (bool)(this->auto_ ^ 1);
    _Var1 = 1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&g);
  return _Var1;
}

Assistant:

wait_result event::wait(const std::chrono::nanoseconds duration) {
  const auto deadline = std::chrono::high_resolution_clock::now() + duration;
  std::unique_lock g(mutex_);

  if (!cond_.wait_until(g, deadline, [this] { return triggered_; })) {
    return wait_result::timeout;
  }

  triggered_ = !auto_;

  return wait_result::signaled;
}